

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::boolToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,bool b)

{
  undefined7 in_register_00000011;
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if ((int)CONCAT71(in_register_00000011,b) == 0) {
    pcVar2 = "false";
    paVar1 = &local_a;
  }
  else {
    pcVar2 = "true";
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::boolToString(bool b) const {
  if (b) {
    return "true";
  } else {
    return "false";
  }
}